

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall
Board::draw_board(Board *this,set<Point,_std::less<Point>,_std::allocator<Point>_> *possible_moves,
                 map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
                 *possible_plays,Point *chosen,uint turn)

{
  ulong uVar1;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *p_Var2;
  bool bVar3;
  uchar uVar4;
  char cVar5;
  const_iterator cVar6;
  iterator iVar7;
  dimension x;
  int iVar8;
  uchar background;
  short sVar9;
  ulong uVar10;
  set<Point,_std::less<Point>,_std::allocator<Point>_> threatened;
  Point local_a8;
  Point local_a4;
  string local_a0;
  ulong local_80;
  int local_74;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *local_70;
  _Base_ptr local_68;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> local_60;
  
  local_70 = &possible_moves->_M_t;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  sVar9 = -8;
  do {
    print_char_index((char)sVar9 + 'I');
    sVar9 = sVar9 + 1;
  } while (sVar9 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  p_Var2 = local_70;
  get_threatened((set<Point,_std::less<Point>,_std::allocator<Point>_> *)&local_60,this,
                 (set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_70,possible_plays,
                 chosen,turn);
  local_68 = &(((_Rep_type *)&p_Var2->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  uVar10 = 7;
  do {
    sVar9 = (short)uVar10;
    local_74 = (int)(short)(sVar9 + 1);
    print_index(sVar9 + 1);
    iVar8 = 0;
    local_80 = uVar10;
    do {
      x = (dimension)iVar8;
      Point::Point((Point *)&local_a0,x,sVar9);
      bVar3 = Point::operator==((Point *)&local_a0,chosen);
      background = 0xdc;
      if (!bVar3) {
        Point::Point((Point *)&local_a0,x,sVar9);
        cVar6 = std::
                _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                ::find(local_70,(key_type *)&local_a0);
        if (cVar6._M_node == local_68) {
          background = ((char)local_80 + (char)iVar8 & 1U) * '\x02' + 0xf3;
        }
        else {
          Point::Point((Point *)&local_a0,x,sVar9);
          iVar7 = std::
                  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                  ::find(&local_60,(key_type *)&local_a0);
          if ((_Rb_tree_header *)iVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
            background = '\"';
            uVar4 = '\x1c';
          }
          else {
            background = 0xa0;
            uVar4 = '|';
          }
          if (((int)local_80 + iVar8 & 1U) == 0) {
            background = uVar4;
          }
        }
      }
      Point::Point((Point *)&local_a0,x,sVar9);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(short)local_a0._M_dataplus._M_p].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_a0._M_dataplus._M_p._2_2_ * 0x10) == 0) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"  ","");
        print_colorful(&local_a0,'\0',background);
      }
      else {
        Point::Point(&local_a4,x,sVar9);
        (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_a4.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_a4.m_y * 0x10) + 0x18))(&local_a0);
        Point::Point(&local_a8,x,sVar9);
        cVar5 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                      
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_a8.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_a8.m_y * 0x10) + 0x20))();
        print_colorful(&local_a0,-cVar5,background);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 8);
    print_index((dimension)local_74);
    uVar1 = local_80;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar10 = (ulong)((int)uVar1 - 1);
  } while ((int)uVar1 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  sVar9 = -8;
  do {
    print_char_index((char)sVar9 + 'I');
    sVar9 = sVar9 + 1;
  } while (sVar9 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
  ~_Rb_tree(&local_60);
  return;
}

Assistant:

void Board::draw_board(const set<Point> &possible_moves, const map<Point, play> &possible_plays, const Point &chosen,
                       unsigned int turn) {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(possible_moves, possible_plays, chosen, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (Point(j, i) == chosen) {
                background = 220;
#if DISPLAY_HINTS
            } else if ((possible_moves.find({j, i}) == possible_moves.end())) {
#else
                }
#endif // DISPLAY_HINTS
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
#if DISPLAY_HINTS
            } else {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
            }
#endif // DISPLAY_HINTS

            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", colors::black, background);
            } else {
                print_colorful(m_board[{j, i}]->get_representation(),
                               (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
            }
        }
        print_index(i + 1);
        cout << endl;
    }